

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_make_syntax_err_help_msg
              (arg_dstr_t ds,char *name,int help,int nerrors,void **argtable,arg_end *end,
              int *exitcode)

{
  arg_end *end_local;
  void **argtable_local;
  int nerrors_local;
  int help_local;
  char *name_local;
  arg_dstr_t ds_local;
  
  if (help < 1) {
    if (nerrors < 1) {
      ds_local._4_4_ = 0;
    }
    else {
      arg_make_syntax_err_msg(ds,argtable,end);
      *exitcode = 1;
      ds_local._4_4_ = 1;
    }
  }
  else {
    arg_make_help_msg(ds,name,argtable);
    *exitcode = 0;
    ds_local._4_4_ = 1;
  }
  return ds_local._4_4_;
}

Assistant:

int arg_make_syntax_err_help_msg(arg_dstr_t ds, char* name, int help, int nerrors, void** argtable, struct arg_end* end, int* exitcode) {
    /* help handling
     * note: '-h|--help' takes precedence over error reporting
     */
    if (help > 0) {
        arg_make_help_msg(ds, name, argtable);
        *exitcode = EXIT_SUCCESS;
        return 1;
    }

    /* syntax error handling */
    if (nerrors > 0) {
        arg_make_syntax_err_msg(ds, argtable, end);
        *exitcode = EXIT_FAILURE;
        return 1;
    }

    return 0;
}